

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base58_tests.cpp
# Opt level: O3

void __thiscall
base58_tests::base58_random_encode_decode::test_method(base58_random_encode_decode *this)

{
  uchar *__s1;
  uchar *puVar1;
  pointer puVar2;
  size_type sVar3;
  bool bVar4;
  readonly_property<bool> rVar5;
  uint uVar6;
  int iVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  FastRandomContext *this_00;
  uint uVar10;
  int iVar11;
  iterator in_R8;
  iterator pvVar12;
  iterator in_R9;
  iterator pvVar13;
  uchar *arg;
  _Alloc_hider __args;
  size_t __n;
  uint64_t uVar14;
  uint uVar15;
  long in_FS_OFFSET;
  Span<const_unsigned_char> input;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  vector<unsigned_char,_std::allocator<unsigned_char>_> decoded;
  string encoded;
  check_type cVar16;
  char *local_170;
  char *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  lazy_ostream local_f0;
  undefined1 *local_e0;
  char **local_d8;
  assertion_result local_d0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  char *local_a8;
  char *local_a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_98;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_rng;
  iVar11 = 0;
  do {
    uVar8 = RandomMixin<FastRandomContext>::randbits
                      (&this_00->super_RandomMixin<FastRandomContext>,8);
    uVar15 = (uint)uVar8;
    uVar10 = uVar15 + 1;
    uVar9 = RandomMixin<FastRandomContext>::randbits<1>
                      (&this_00->super_RandomMixin<FastRandomContext>);
    uVar14 = 0;
    if (uVar9 != 0) {
      if (uVar10 == 0) {
        uVar6 = 0x20;
      }
      else {
        uVar6 = 0x1f;
        if (uVar10 != 0) {
          for (; uVar10 >> uVar6 == 0; uVar6 = uVar6 - 1) {
          }
        }
        uVar6 = uVar6 ^ 0x1f;
      }
      do {
        uVar14 = RandomMixin<FastRandomContext>::randbits
                           (&this_00->super_RandomMixin<FastRandomContext>,0x20 - uVar6);
      } while (uVar10 < uVar14);
    }
    local_f0._vptr_lazy_ostream =
         (_func_int **)((ulong)local_f0._vptr_lazy_ostream & 0xffffffffffffff00);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_78,uVar14 & 0xffffffff,(value_type_conflict3 *)&local_f0,
               (allocator_type *)&local_98);
    RandomMixin<FastRandomContext>::randbytes<unsigned_char>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58,
               &this_00->super_RandomMixin<FastRandomContext>,(ulong)(uVar10 - (int)uVar14));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              (&local_78,
               (long)(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish + local_58._M_string_length) -
               (long)(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start + (long)local_58._M_dataplus._M_p));
    sVar3 = local_58._M_string_length;
    __s1 = local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
    puVar1 = local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar2 = local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    for (__args._M_p = local_58._M_dataplus._M_p; __args._M_p != (pointer)sVar3;
        __args._M_p = __args._M_p + 1) {
      local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = __s1;
      local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar1;
      local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = puVar2;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&local_78,(uchar *)__args._M_p);
      __s1 = local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
      puVar1 = local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
      puVar2 = local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (uchar *)0x0;
    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (uchar *)0x0;
    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (((uchar *)local_58._M_dataplus._M_p != (uchar *)0x0) &&
       (operator_delete(local_58._M_dataplus._M_p,
                        local_58.field_2._M_allocated_capacity - (long)local_58._M_dataplus._M_p),
       local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start != (uchar *)0x0)) {
      operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    __n = (long)puVar1 - (long)__s1;
    input.m_size = __n;
    input.m_data = __s1;
    EncodeBase58Check_abi_cxx11_(&local_58,input);
    local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (uVar15 == 0) {
      uVar6 = 0x20;
    }
    else {
      uVar6 = 0x1f;
      if (uVar15 != 0) {
        for (; uVar15 >> uVar6 == 0; uVar6 = uVar6 - 1) {
        }
      }
      uVar6 = uVar6 ^ 0x1f;
    }
    do {
      uVar9 = RandomMixin<FastRandomContext>::randbits
                        (&this_00->super_RandomMixin<FastRandomContext>,0x20 - uVar6);
    } while ((uVar8 & 0xffffffff) < uVar9);
    bVar4 = DecodeBase58Check(&local_58,&local_98,(int)uVar9);
    local_a8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/base58_tests.cpp"
    ;
    local_a0 = "";
    local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x5e;
    file.m_begin = (iterator)&local_a8;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_b8,msg);
    local_d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)!bVar4;
    local_d0.m_message.px = (element_type *)0x0;
    local_d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_100 = "!ok_too_small";
    local_f8 = "";
    local_f0.m_empty = false;
    local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
    local_e0 = boost::unit_test::lazy_ostream::inst;
    local_d8 = &local_100;
    local_110 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/base58_tests.cpp"
    ;
    local_108 = "";
    pvVar12 = (iterator)0x1;
    pvVar13 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_d0,&local_f0,1,0,WARN,_cVar16,(size_t)&local_110,0x5e);
    boost::detail::shared_count::~shared_count(&local_d0.m_message.pn);
    uVar15 = 0xff - uVar15;
    if (uVar15 == 0) {
      uVar6 = 0x20;
    }
    else {
      uVar6 = 0x1f;
      if (uVar15 != 0) {
        for (; uVar15 >> uVar6 == 0; uVar6 = uVar6 - 1) {
        }
      }
      uVar6 = uVar6 ^ 0x1f;
    }
    do {
      uVar8 = RandomMixin<FastRandomContext>::randbits
                        (&this_00->super_RandomMixin<FastRandomContext>,0x20 - uVar6);
    } while (uVar15 < uVar8);
    rVar5.super_class_property<bool>.value =
         (class_property<bool>)DecodeBase58Check(&local_58,&local_98,uVar10 + (int)uVar8);
    local_120 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/base58_tests.cpp"
    ;
    local_118 = "";
    local_130 = &boost::unit_test::basic_cstring<char_const>::null;
    local_128 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x60;
    file_00.m_begin = (iterator)&local_120;
    msg_00.m_end = pvVar13;
    msg_00.m_begin = pvVar12;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_130,
               msg_00);
    local_d0.m_message.px = (element_type *)0x0;
    local_d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_100 = "ok";
    local_f8 = "";
    local_f0.m_empty = false;
    local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
    local_e0 = boost::unit_test::lazy_ostream::inst;
    local_d8 = &local_100;
    local_140 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/base58_tests.cpp"
    ;
    local_138 = "";
    pvVar12 = (iterator)0x1;
    pvVar13 = (iterator)0x0;
    local_d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)rVar5.super_class_property<bool>.value;
    boost::test_tools::tt_detail::report_assertion
              (&local_d0,&local_f0,1,0,WARN,_cVar16,(size_t)&local_140,0x60);
    boost::detail::shared_count::~shared_count(&local_d0.m_message.pn);
    local_150 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/base58_tests.cpp"
    ;
    local_148 = "";
    local_160 = &boost::unit_test::basic_cstring<char_const>::null;
    local_158 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0x61;
    file_01.m_begin = (iterator)&local_150;
    msg_01.m_end = pvVar13;
    msg_01.m_begin = pvVar12;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_160,
               msg_01);
    if (__n == (long)local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start) {
      if (puVar1 == __s1) {
        local_d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)(class_property<bool>)0x1;
      }
      else {
        iVar7 = bcmp(__s1,local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,__n);
        local_d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)(iVar7 == 0);
      }
    }
    else {
      local_d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(class_property<bool>)0x0;
    }
    local_d0.m_message.px = (element_type *)0x0;
    local_d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_100 = "data == decoded";
    local_f8 = "";
    local_f0.m_empty = false;
    local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
    local_e0 = boost::unit_test::lazy_ostream::inst;
    local_d8 = &local_100;
    local_170 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/base58_tests.cpp"
    ;
    local_168 = "";
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_d0,&local_f0,1,0,WARN,_cVar16,(size_t)&local_170,0x61);
    boost::detail::shared_count::~shared_count(&local_d0.m_message.pn);
    if (local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_98.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_98.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if (__s1 != (uchar *)0x0) {
      operator_delete(__s1,(long)puVar2 - (long)__s1);
    }
    iVar11 = iVar11 + 1;
  } while (iVar11 != 1000);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(base58_random_encode_decode)
{
    for (int n = 0; n < 1000; ++n) {
        unsigned int len = 1 + m_rng.randbits(8);
        unsigned int zeroes = m_rng.randbool() ? m_rng.randrange(len + 1) : 0;
        auto data = Cat(std::vector<unsigned char>(zeroes, '\000'), m_rng.randbytes(len - zeroes));
        auto encoded = EncodeBase58Check(data);
        std::vector<unsigned char> decoded;
        auto ok_too_small = DecodeBase58Check(encoded, decoded, m_rng.randrange(len));
        BOOST_CHECK(!ok_too_small);
        auto ok = DecodeBase58Check(encoded, decoded, len + m_rng.randrange(257 - len));
        BOOST_CHECK(ok);
        BOOST_CHECK(data == decoded);
    }
}